

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool Fossilize::StreamArchive::find_entry_from_metadata
               (ExportedMetadataHeader *header,ResourceTag tag,Hash hash,Entry *entry)

{
  uint64_t uVar1;
  uint32_t uVar2;
  long lVar3;
  ExportedMetadataBlock *pEVar4;
  ExportedMetadataBlock *itr;
  ExportedMetadataBlock *blocks;
  size_t count;
  Entry *entry_local;
  Hash hash_local;
  ExportedMetadataHeader *pEStack_18;
  ResourceTag tag_local;
  ExportedMetadataHeader *header_local;
  
  uVar1 = header->lists[tag].count;
  if (uVar1 == 0) {
    header_local._7_1_ = false;
  }
  else {
    lVar3 = (long)&((ExportedMetadataHeader *)(header->lists + -1))->magic +
            header->lists[tag].offset;
    entry_local = (Entry *)hash;
    hash_local._4_4_ = tag;
    pEStack_18 = header;
    pEVar4 = std::
             lower_bound<Fossilize::ExportedMetadataBlock_const*,unsigned_long,Fossilize::StreamArchive::find_entry_from_metadata(Fossilize::ExportedMetadataHeader_const*,Fossilize::ResourceTag,unsigned_long,Fossilize::StreamArchive::Entry*)::_lambda(Fossilize::ExportedMetadataBlock_const&,unsigned_long)_1_>
                       (lVar3,lVar3 + uVar1 * 0x20,&entry_local);
    if ((pEVar4 == (ExportedMetadataBlock *)(lVar3 + uVar1 * 0x20)) ||
       ((Entry *)pEVar4->hash != entry_local)) {
      header_local._7_1_ = false;
    }
    else {
      if (entry != (Entry *)0x0) {
        entry->offset = pEVar4->file_offset;
        uVar2 = (pEVar4->payload).format;
        (entry->header).payload_size = (pEVar4->payload).payload_size;
        (entry->header).format = uVar2;
        uVar2 = (pEVar4->payload).uncompressed_size;
        (entry->header).crc = (pEVar4->payload).crc;
        (entry->header).uncompressed_size = uVar2;
      }
      header_local._7_1_ = true;
    }
  }
  return header_local._7_1_;
}

Assistant:

static bool find_entry_from_metadata(const ExportedMetadataHeader *header, ResourceTag tag, Hash hash, Entry *entry)
	{
		size_t count = header->lists[tag].count;
		if (!count)
			return false;

		// Binary search in-place.
		auto *blocks = reinterpret_cast<const ExportedMetadataBlock *>(
				reinterpret_cast<const uint8_t *>(header) + header->lists[tag].offset);

		auto itr = std::lower_bound(blocks, blocks + count, hash, [](const ExportedMetadataBlock &a, Hash hash_) {
			return a.hash < hash_;
		});

		if (itr != blocks + count && itr->hash == hash)
		{
			if (entry)
			{
				entry->offset = itr->file_offset;
				entry->header = itr->payload;
			}
			return true;
		}
		else
			return false;
	}